

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.cpp
# Opt level: O3

string * __thiscall
ser::Serializer::ToString_abi_cxx11_(string *__return_storage_ptr__,Serializer *this)

{
  element_type *peVar1;
  pointer pcVar2;
  ostream *poVar3;
  ostringstream ss;
  char *local_240;
  long local_238;
  char local_230 [16];
  char *local_220;
  long local_218;
  char local_210 [16];
  string local_200;
  string local_1e0;
  string local_1c0;
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Serializer\n",0xb);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,"Directory: ",0xb);
  peVar1 = (this->pFileFormat_).px;
  if (peVar1 != (element_type *)0x0) {
    pcVar2 = (peVar1->directory_)._M_dataplus._M_p;
    local_220 = local_210;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_220,pcVar2,pcVar2 + (peVar1->directory_)._M_string_length);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_1a0,local_220,local_218);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Prefix: ",8);
    peVar1 = (this->pFileFormat_).px;
    if (peVar1 != (element_type *)0x0) {
      pcVar2 = (peVar1->prefix_)._M_dataplus._M_p;
      local_240 = local_230;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar2,pcVar2 + (peVar1->prefix_)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,local_240,local_238);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"Globalmetainfo: ",0x10);
      MetainfoSet::ToString_abi_cxx11_(&local_1c0,&this->globalMetainfo_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\n",1);
      FieldsTable::ToString_abi_cxx11_(&local_1e0,&this->fieldsTable_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      OffsetTable::ToString_abi_cxx11_(&local_200,&this->offsetTable_);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar3,local_200._M_dataplus._M_p,local_200._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,"----------------------------------------------\n",0x2f);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
        operator_delete(local_1c0._M_dataplus._M_p);
      }
      if (local_240 != local_230) {
        operator_delete(local_240);
      }
      if (local_220 != local_210) {
        operator_delete(local_220);
      }
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream(local_1a0);
      std::ios_base::~ios_base(local_130);
      return __return_storage_ptr__;
    }
  }
  __assert_fail("px != 0","/usr/include/boost/smart_ptr/shared_ptr.hpp",0x2d8,
                "typename boost::detail::sp_member_access<T>::type boost::shared_ptr<ser::FileFormat>::operator->() const [T = ser::FileFormat]"
               );
}

Assistant:

std::string Serializer::ToString() const
{
    std::ostringstream ss;
    ss << "Serializer\n"
       << "Directory: " << pFileFormat_->directory() << "\n"
       << "Prefix: " << pFileFormat_->prefix() << "\n"
       << "Globalmetainfo: " << globalMetainfo_.ToString() << "\n"
       << fieldsTable_.ToString()
       << offsetTable_.ToString()
       << "----------------------------------------------\n";
    return ss.str();
}